

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop-start.c
# Opt level: O2

void on_read1(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  if (nread < 0) {
    pcVar3 = ">=";
    pcVar2 = "nread";
    uVar4 = 0x41;
    eval_a = nread;
  }
  else {
    do_write(stream,on_write);
    iVar1 = uv_read_stop(stream);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_read_start(stream,on_alloc,on_read2);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        read_cb_called = read_cb_called + 1;
        return;
      }
      pcVar3 = "==";
      pcVar2 = "uv_read_start(stream, on_alloc, on_read2)";
      uVar4 = 0x4a;
    }
    else {
      pcVar3 = "==";
      pcVar2 = "uv_read_stop(stream)";
      uVar4 = 0x48;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
          ,uVar4,pcVar2,pcVar3,"0",eval_a,pcVar3,0);
  abort();
}

Assistant:

static void on_read1(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_GE(nread, 0);

  /* Do write on a half open connection to force WSAECONNABORTED (on Windows)
   * in the subsequent uv_read_start()
   */
  do_write(stream, on_write);

  ASSERT_OK(uv_read_stop(stream));

  ASSERT_OK(uv_read_start(stream, on_alloc, on_read2));

  read_cb_called++;
}